

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Runner::~Runner(Runner *this)

{
  Runner *this_local;
  
  std::set<Catch::TestCase,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>::~set
            (&this->m_testsAlreadyRun);
  Ptr<Catch::IStreamingReporter>::~Ptr(&this->m_reporter);
  std::ofstream::~ofstream(&this->m_ofs);
  Ptr<Catch::Config>::~Ptr(&this->m_config);
  return;
}

Assistant:

Runner( Ptr<Config> const& config )
        :   m_config( config )
        {
            openStream();
            makeReporter();
        }